

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

bool internalJSONNode::AreEqualNoCase(char *ch_one,char *ch_two)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  
  bVar2 = *ch_one;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(ch_one + 1);
    do {
      bVar1 = *ch_two;
      if (bVar2 != bVar1) {
        if ((byte)(bVar1 + 0xbf) < 0x1a) {
          if (bVar2 != (bVar1 | 0x20)) {
            return false;
          }
        }
        else {
          if (0x19 < (byte)(bVar1 + 0x9f)) {
            return false;
          }
          if (bVar2 != (byte)(bVar1 - 0x20)) {
            return false;
          }
        }
      }
      ch_two = (char *)((byte *)ch_two + 1);
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  return *ch_two == 0;
}

Assistant:

bool internalJSONNode::AreEqualNoCase(const json_char * ch_one, const json_char * ch_two) json_nothrow {
	   while (*ch_one){  //only need to check one, if the other one terminates early, the check will cause it to fail
		  const json_char c_one = *ch_one;
		  const json_char c_two = *ch_two;
		  if (c_one != c_two){
			 if ((c_two > 64) && (c_two < 91)){  //A - Z
				if (c_one != (json_char)(c_two + 32)) return false;
			 } else if ((c_two > 96) && (c_two < 123)){  //a - z
				if (c_one != (json_char)(c_two - 32)) return false;
			 } else { //not a letter, so return false
				return false;
			 }
		  }
		  ++ch_one;
		  ++ch_two;

	   }
	   return *ch_two == '\0';  //this one has to be null terminated too, or else json_string two is longer, hence, not equal
    }